

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option * __thiscall CLI::Option::excludes(Option *this,Option *opt)

{
  IncorrectConstruction *this_00;
  Option *local_50;
  string local_48;
  Option *local_28;
  
  local_50 = opt;
  if (opt != this) {
    ::std::
    _Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
    ::_M_insert_unique<CLI::Option*const&>
              ((_Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
                *)&this->excludes_,&local_50);
    local_28 = this;
    ::std::
    _Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
    ::_M_insert_unique<CLI::Option*>
              ((_Rb_tree<CLI::Option*,CLI::Option*,std::_Identity<CLI::Option*>,std::less<CLI::Option*>,std::allocator<CLI::Option*>>
                *)&local_50->excludes_,&local_28);
    return this;
  }
  this_00 = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"and option cannot exclude itself","");
  CLI::IncorrectConstruction::IncorrectConstruction(this_00,&local_48);
  __cxa_throw(this_00,&CLI::IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

CLI11_INLINE Option *Option::excludes(Option *opt) {
    if(opt == this) {
        throw(IncorrectConstruction("and option cannot exclude itself"));
    }
    excludes_.insert(opt);

    // Help text should be symmetric - excluding a should exclude b
    opt->excludes_.insert(this);

    // Ignoring the insert return value, excluding twice is now allowed.
    // (Mostly to allow both directions to be excluded by user, even though the library does it for you.)

    return this;
}